

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifyrsa.cpp
# Opt level: O1

void Base64Encode(uchar *buffer,size_t length,char **base64Text)

{
  long in_RAX;
  BIO_METHOD *pBVar1;
  BIO *pBVar2;
  BIO *append;
  BUF_MEM *bufferPtr;
  long local_28;
  
  local_28 = in_RAX;
  pBVar1 = BIO_f_base64();
  pBVar2 = BIO_new(pBVar1);
  pBVar1 = BIO_s_mem();
  append = BIO_new(pBVar1);
  pBVar2 = BIO_push(pBVar2,append);
  BIO_write(pBVar2,buffer,(int)length);
  BIO_ctrl(pBVar2,0xb,0,(void *)0x0);
  BIO_ctrl(pBVar2,0x73,0,&local_28);
  BIO_ctrl(pBVar2,9,0,(void *)0x0);
  BIO_free_all(pBVar2);
  *base64Text = *(char **)(local_28 + 8);
  return;
}

Assistant:

void Base64Encode( const unsigned char* buffer,
                   size_t length,
                   char** base64Text) {
  BIO *bio, *b64;
  BUF_MEM *bufferPtr;

  b64 = BIO_new(BIO_f_base64());
  bio = BIO_new(BIO_s_mem());
  bio = BIO_push(b64, bio);

  BIO_write(bio, buffer, static_cast<int>(length));
  BIO_flush(bio);
  BIO_get_mem_ptr(bio, &bufferPtr);
  BIO_set_close(bio, BIO_NOCLOSE);
  BIO_free_all(bio);

  *base64Text=(*bufferPtr).data;
}